

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerialSimulationDataGenerator.cpp
# Opt level: O0

void __thiscall
SerialSimulationDataGenerator::Initialize
          (SerialSimulationDataGenerator *this,U32 simulation_sample_rate,
          SerialAnalyzerSettings *settings)

{
  uint uVar1;
  int iVar2;
  uint local_28;
  U32 i;
  U32 num_bits;
  SerialAnalyzerSettings *settings_local;
  U32 simulation_sample_rate_local;
  SerialSimulationDataGenerator *this_local;
  
  this->mSimulationSampleRateHz = simulation_sample_rate;
  this->mSettings = settings;
  iVar2 = (int)this;
  ClockGenerator::Init((double)this->mSettings->mBitRate,iVar2 + 0x38);
  SimulationChannelDescriptor::SetChannel((Channel *)&this->mSerialSimulationData);
  SimulationChannelDescriptor::SetSampleRate(iVar2 + 0x40);
  if ((this->mSettings->mInverted & 1U) == 0) {
    this->mBitLow = BIT_LOW;
    this->mBitHigh = BIT_HIGH;
  }
  else {
    this->mBitLow = BIT_HIGH;
    this->mBitHigh = BIT_LOW;
  }
  SimulationChannelDescriptor::SetInitialBitState(iVar2 + 0x40);
  ClockGenerator::AdvanceByHalfPeriod(10.0);
  SimulationChannelDescriptor::Advance(iVar2 + 0x40);
  this->mValue = 0;
  this->mMpModeAddressMask = 0;
  this->mMpModeDataMask = 0;
  this->mNumBitsMask = 0;
  uVar1 = this->mSettings->mBitsPerTransfer;
  for (local_28 = 0; local_28 < uVar1; local_28 = local_28 + 1) {
    this->mNumBitsMask = this->mNumBitsMask << 1;
    this->mNumBitsMask = this->mNumBitsMask | 1;
  }
  if (this->mSettings->mSerialMode == MpModeMsbOneMeansAddress) {
    this->mMpModeAddressMask = 1L << ((byte)this->mSettings->mBitsPerTransfer & 0x3f);
  }
  if (this->mSettings->mSerialMode == MpModeMsbZeroMeansAddress) {
    this->mMpModeDataMask = 1L << ((byte)this->mSettings->mBitsPerTransfer & 0x3f);
  }
  return;
}

Assistant:

void SerialSimulationDataGenerator::Initialize( U32 simulation_sample_rate, SerialAnalyzerSettings* settings )
{
    mSimulationSampleRateHz = simulation_sample_rate;
    mSettings = settings;

    mClockGenerator.Init( mSettings->mBitRate, simulation_sample_rate );
    mSerialSimulationData.SetChannel( mSettings->mInputChannel );
    mSerialSimulationData.SetSampleRate( simulation_sample_rate );

    if( mSettings->mInverted == false )
    {
        mBitLow = BIT_LOW;
        mBitHigh = BIT_HIGH;
    }
    else
    {
        mBitLow = BIT_HIGH;
        mBitHigh = BIT_LOW;
    }

    mSerialSimulationData.SetInitialBitState( mBitHigh );
    mSerialSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

    mValue = 0;

    mMpModeAddressMask = 0;
    mMpModeDataMask = 0;
    mNumBitsMask = 0;

    U32 num_bits = mSettings->mBitsPerTransfer;
    for( U32 i = 0; i < num_bits; i++ )
    {
        mNumBitsMask <<= 1;
        mNumBitsMask |= 0x1;
    }

    if( mSettings->mSerialMode == SerialAnalyzerEnums::MpModeMsbOneMeansAddress )
        mMpModeAddressMask = 0x1ull << ( mSettings->mBitsPerTransfer );

    if( mSettings->mSerialMode == SerialAnalyzerEnums::MpModeMsbZeroMeansAddress )
        mMpModeDataMask = 0x1ull << ( mSettings->mBitsPerTransfer );
}